

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Parser_Y.H
# Opt level: O0

double amrex::parser_math_jn<double>(int a,double b)

{
  int in_EDI;
  double in_XMM0_Qa;
  double dVar1;
  
  dVar1 = jn(in_EDI,in_XMM0_Qa);
  return dVar1;
}

Assistant:

AMREX_GPU_HOST_DEVICE AMREX_NO_INLINE
T parser_math_jn (int a, T b)
{
#if defined AMREX_USE_DPCPP || defined __MINGW32__
    amrex::ignore_unused(a,b);
    // neither jn(f) nor std::cyl_bessel_j work yet
    // https://github.com/oneapi-src/oneAPI-spec/issues/308
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(false, "parser: jn in SYCL/DPC++ not supported yet");
    return 0.0;
#else
    return jn(a, b);
#endif
}